

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseEncoding(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (0x1ffff < iVar4 || 0xff < iVar3) {
    bVar9 = false;
    goto LAB_002d79f2;
  }
  bVar9 = ParseName(state);
  if (bVar9) {
    bVar10 = ParseBareFunctionType(state);
    bVar9 = true;
    if (bVar10) {
      ParseQRequiresClauseExpr(state);
    }
    goto LAB_002d79f2;
  }
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (iVar4 < 0x20000 && iVar3 < 0x100) {
    pPVar1 = &state->parse_state;
    iVar3 = (state->parse_state).prev_name_idx;
    uVar7 = (state->parse_state).mangled_idx;
    uVar8 = (state->parse_state).out_cur_idx;
    uVar5 = *(uint *)&(state->parse_state).field_0xc;
    bVar9 = ParseTwoCharToken(state,"TW");
    if (bVar9) {
      MaybeAppend(state,"thread-local wrapper routine for ");
      bVar10 = ParseName(state);
LAB_002d79d1:
      bVar9 = true;
      if (bVar10 == false) {
LAB_002d79d8:
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        goto LAB_002d79ed;
      }
    }
    else {
      bVar9 = ParseTwoCharToken(state,"TH");
      if (bVar9) {
        MaybeAppend(state,"thread-local initialization routine for ");
        bVar10 = ParseName(state);
        goto LAB_002d79d1;
      }
      bVar9 = ParseOneCharToken(state,'T');
      if ((!bVar9) || (bVar9 = ParseCharClass(state,"VTIS"), !bVar9)) {
LAB_002d7a37:
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseTwoCharToken(state,"Tc");
        if (((bVar9) && (bVar9 = ParseCallOffset(state), bVar9)) &&
           (bVar9 = ParseCallOffset(state), bVar9)) {
          bVar10 = ParseEncoding(state);
          bVar9 = true;
          if (bVar10) goto LAB_002d79ef;
        }
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseTwoCharToken(state,"GV");
        if (bVar9) {
          bVar10 = ParseName(state);
          bVar9 = true;
          if (bVar10) goto LAB_002d79ef;
        }
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseOneCharToken(state,'T');
        if ((bVar9) && (bVar9 = ParseCallOffset(state), bVar9)) {
          bVar10 = ParseEncoding(state);
          bVar9 = true;
          if (bVar10) goto LAB_002d79ef;
        }
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseTwoCharToken(state,"TC");
        if (((bVar9) && (bVar9 = ParseType(state), bVar9)) &&
           ((bVar9 = ParseNumber(state,(int *)0x0), bVar9 &&
            (bVar9 = ParseOneCharToken(state,'_'), bVar9)))) {
          puVar2 = &(state->parse_state).field_0xf;
          *puVar2 = *puVar2 & 0x7f;
          bVar9 = ParseType(state);
          if (!bVar9) goto LAB_002d7b87;
          *(uint *)&(state->parse_state).field_0xc =
               *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar5 & 0x80000000;
LAB_002d7d7e:
          bVar9 = true;
          goto LAB_002d79ef;
        }
LAB_002d7b87:
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseOneCharToken(state,'T');
        if ((bVar9) && (bVar9 = ParseCharClass(state,"FJ"), bVar9)) {
          bVar10 = ParseType(state);
          bVar9 = true;
          if (bVar10) goto LAB_002d79ef;
        }
        (state->parse_state).prev_name_idx = iVar3;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(uint *)&(state->parse_state).field_0xc = uVar5;
        bVar9 = ParseTwoCharToken(state,"GR");
        if (bVar9) {
          MaybeAppend(state,"reference temporary for ");
          bVar9 = ParseName(state);
          if (bVar9) {
            bVar10 = ParseSeqId(state);
            bVar11 = ParseOneCharToken(state,'_');
            bVar9 = true;
            if ((bVar11) || (!bVar10)) goto LAB_002d79ef;
          }
        }
        else {
          bVar9 = ParseTwoCharToken(state,"GA");
          if (bVar9) {
            bVar10 = ParseEncoding(state);
            bVar9 = true;
            if (bVar10) goto LAB_002d79ef;
          }
          (state->parse_state).prev_name_idx = iVar3;
          pPVar1->mangled_idx = uVar7;
          pPVar1->out_cur_idx = uVar8;
          *(uint *)&(state->parse_state).field_0xc = uVar5;
          bVar9 = ParseThreeCharToken(state,"GTt");
          if (bVar9) {
            MaybeAppend(state,"transaction clone for ");
            bVar10 = ParseEncoding(state);
            bVar9 = true;
            if (bVar10) goto LAB_002d79ef;
          }
          (state->parse_state).prev_name_idx = iVar3;
          pPVar1->mangled_idx = uVar7;
          pPVar1->out_cur_idx = uVar8;
          *(uint *)&(state->parse_state).field_0xc = uVar5;
          bVar9 = ParseOneCharToken(state,'T');
          if (((bVar9) && (bVar9 = ParseCharClass(state,"hv"), bVar9)) &&
             (bVar9 = ParseCallOffset(state), bVar9)) {
            bVar10 = ParseEncoding(state);
            bVar9 = true;
            if (bVar10) goto LAB_002d79ef;
          }
          (state->parse_state).prev_name_idx = iVar3;
          pPVar1->mangled_idx = uVar7;
          pPVar1->out_cur_idx = uVar8;
          *(uint *)&(state->parse_state).field_0xc = uVar5;
          bVar9 = ParseTwoCharToken(state,"TA");
          if (bVar9) {
            uVar6 = *(uint *)&(state->parse_state).field_0xc;
            *(uint *)&(state->parse_state).field_0xc = uVar6 & 0x7fffffff;
            bVar9 = ParseTemplateArg(state);
            if (bVar9) {
              *(uint *)&(state->parse_state).field_0xc =
                   *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar6 & 0x80000000;
              MaybeAppend(state,"template parameter object");
              goto LAB_002d7d7e;
            }
          }
        }
        goto LAB_002d79d8;
      }
      bVar10 = ParseType(state);
      bVar9 = true;
      if (!bVar10) goto LAB_002d7a37;
    }
  }
  else {
LAB_002d79ed:
    bVar9 = false;
  }
LAB_002d79ef:
  state->recursion_depth = state->recursion_depth + -1;
LAB_002d79f2:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar9;
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Since the first two productions both start with <name>, attempt
  // to parse it only once to avoid exponential blowup of backtracking.
  //
  // We're careful about exponential blowup because <encoding> recursively
  // appears in other productions downstream of its first two productions,
  // which means that every call to `ParseName` would possibly indirectly
  // result in two calls to `ParseName` etc.
  if (ParseName(state)) {
    if (!ParseBareFunctionType(state)) {
      return true;  // <(data) name>
    }

    // Parsed: <(function) name> <bare-function-type>
    // Pending: [`Q` <requires-clause expr>]
    ParseQRequiresClauseExpr(state);  // restores state on failure
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;  // <special-name>
  }
  return false;
}